

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pprinter.cc
# Opt level: O1

string * __thiscall
tinyusdz::to_string_abi_cxx11_
          (string *__return_storage_ptr__,tinyusdz *this,UsdUVTexture *tex,uint32_t indent,
          bool closing_brace)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  ostream *poVar2;
  uint32_t uVar3;
  uint32_t n;
  uint32_t extraout_EDX;
  uint32_t extraout_EDX_00;
  stringstream ss;
  string local_1d8;
  stringstream local_1b8 [16];
  ostream local_1a8 [112];
  ios_base local_138 [264];
  
  uVar3 = indent;
  ::std::__cxx11::stringstream::stringstream(local_1b8);
  pprint::Indent_abi_cxx11_(&local_1d8,(pprint *)((ulong)tex & 0xffffffff),n);
  poVar2 = ::std::__ostream_insert<char,std::char_traits<char>>
                     (local_1a8,local_1d8._M_dataplus._M_p,local_1d8._M_string_length);
  ::std::__ostream_insert<char,std::char_traits<char>>(poVar2,"{\n",2);
  paVar1 = &local_1d8.field_2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1d8._M_dataplus._M_p != paVar1) {
    operator_delete(local_1d8._M_dataplus._M_p,local_1d8.field_2._M_allocated_capacity + 1);
  }
  print_shader_params_abi_cxx11_(&local_1d8,this,(UsdUVTexture *)((ulong)tex & 0xffffffff),uVar3);
  ::std::__ostream_insert<char,std::char_traits<char>>
            (local_1a8,local_1d8._M_dataplus._M_p,local_1d8._M_string_length);
  uVar3 = extraout_EDX;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1d8._M_dataplus._M_p != paVar1) {
    operator_delete(local_1d8._M_dataplus._M_p,local_1d8.field_2._M_allocated_capacity + 1);
    uVar3 = extraout_EDX_00;
  }
  if ((char)indent != '\0') {
    pprint::Indent_abi_cxx11_(&local_1d8,(pprint *)((ulong)tex & 0xffffffff),uVar3);
    poVar2 = ::std::__ostream_insert<char,std::char_traits<char>>
                       (local_1a8,local_1d8._M_dataplus._M_p,local_1d8._M_string_length);
    ::std::__ostream_insert<char,std::char_traits<char>>(poVar2,"}\n",2);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_1d8._M_dataplus._M_p != paVar1) {
      operator_delete(local_1d8._M_dataplus._M_p,local_1d8.field_2._M_allocated_capacity + 1);
    }
  }
  ::std::__cxx11::stringbuf::str();
  ::std::__cxx11::stringstream::~stringstream(local_1b8);
  ::std::ios_base::~ios_base(local_138);
  return __return_storage_ptr__;
}

Assistant:

std::string to_string(const UsdUVTexture &tex, const uint32_t indent,
                      bool closing_brace) {
  // TODO: Print spec and meta?
  std::stringstream ss;

  ss << pprint::Indent(indent) << "{\n";
  ss << print_shader_params(tex, indent);
  if (closing_brace) {
    ss << pprint::Indent(indent) << "}\n";
  }

  return ss.str();
}